

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::TargetTask::provideValue
          (TargetTask *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  bool bVar1;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *this_00;
  reference ppNVar2;
  pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool> local_c0;
  undefined1 local_a8 [8];
  BuildValue value;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  TargetTask *this_local;
  TaskInterface param_1_local;
  
  value.stringValues.size = (uint64_t)valueData;
  llbuild::buildsystem::BuildValue::fromData((BuildValue *)local_a8,valueData);
  bVar1 = llbuild::buildsystem::BuildValue::isMissingInput((BuildValue *)local_a8);
  if (bVar1) {
    this_00 = llbuild::buildsystem::Target::getNodes(this->target);
    ppNVar2 = std::
              vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
              operator[](this_00,inputID);
    llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::insert
              (&local_c0,
               &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>,
               *ppNVar2);
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_a8);
  return;
}

Assistant:

virtual void provideValue(TaskInterface, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // Do nothing.
    auto value = BuildValue::fromData(valueData);

    if (value.isMissingInput()) {
      missingInputNodes.insert(target.getNodes()[inputID]);
    }
  }